

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterative_method.c
# Opt level: O0

void Iterative_method_BiCGSTAB
               (Sparse_matrix *matrix,double *x,double *b,uint max_iter,Precond_type precond,
               double omega_precond,double accuracy,double *buffer)

{
  uint size_00;
  double *v1;
  double *newVector;
  double *__s;
  double *vector;
  double *vector_00;
  double *v2;
  double *newVector_00;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double accuracy2;
  double bnorm2;
  double rhoold;
  double beta;
  uint iter;
  uint i;
  double *t;
  double *s;
  double *z;
  double *y;
  double *p;
  double *v;
  double *rcap;
  double *r;
  double omega;
  double rho;
  double alpha;
  uint size;
  double *buffer_local;
  double accuracy_local;
  double omega_precond_local;
  Precond_type precond_local;
  uint max_iter_local;
  double *b_local;
  double *x_local;
  Sparse_matrix *matrix_local;
  
  size_00 = matrix->size;
  rho = 1.0;
  omega = 1.0;
  r = (double *)0x3ff0000000000000;
  v1 = buffer + size_00;
  newVector = buffer + (size_00 << 1);
  __s = buffer + size_00 * 3;
  vector = buffer + (size_00 << 2);
  vector_00 = buffer + size_00 * 5;
  v2 = buffer + size_00 * 6;
  newVector_00 = buffer + size_00 * 7;
  dVar1 = scalar_product(b,b,size_00);
  Sparse_matrix_Apply_to_vector(matrix,x,buffer);
  memset(newVector,0,(ulong)size_00 << 3);
  memset(__s,0,(ulong)size_00 << 3);
  for (beta._4_4_ = 0; beta._4_4_ < size_00; beta._4_4_ = beta._4_4_ + 1) {
    buffer[beta._4_4_] = b[beta._4_4_] - buffer[beta._4_4_];
    v1[beta._4_4_] = buffer[beta._4_4_];
  }
  beta._0_4_ = 1;
  while( true ) {
    if (max_iter <= beta._0_4_) {
      printf("\nWarning: maximum number of iterations reached: %u.\n",(ulong)max_iter);
      return;
    }
    dVar2 = scalar_product(v1,buffer,size_00);
    for (beta._4_4_ = 0; beta._4_4_ < size_00; beta._4_4_ = beta._4_4_ + 1) {
      __s[beta._4_4_] =
           ((dVar2 * rho) / (omega * (double)r)) *
           (-(double)r * newVector[beta._4_4_] + __s[beta._4_4_]) + buffer[beta._4_4_];
    }
    (*precond)(matrix,__s,vector,omega_precond);
    Sparse_matrix_Apply_to_vector(matrix,vector,newVector);
    dVar3 = scalar_product(v1,newVector,size_00);
    rho = dVar2 / dVar3;
    for (beta._4_4_ = 0; beta._4_4_ < size_00; beta._4_4_ = beta._4_4_ + 1) {
      v2[beta._4_4_] = -rho * newVector[beta._4_4_] + buffer[beta._4_4_];
    }
    (*precond)(matrix,v2,vector_00,omega_precond);
    Sparse_matrix_Apply_to_vector(matrix,vector_00,newVector_00);
    dVar3 = scalar_product(newVector_00,v2,size_00);
    dVar4 = scalar_product(newVector_00,newVector_00,size_00);
    r = (double *)(dVar3 / dVar4);
    for (beta._4_4_ = 0; beta._4_4_ < size_00; beta._4_4_ = beta._4_4_ + 1) {
      x[beta._4_4_] = rho * vector[beta._4_4_] + (double)r * vector_00[beta._4_4_] + x[beta._4_4_];
    }
    dVar3 = scalar_product(buffer,buffer,size_00);
    if (dVar3 < accuracy * accuracy * dVar1) break;
    for (beta._4_4_ = 0; beta._4_4_ < size_00; beta._4_4_ = beta._4_4_ + 1) {
      buffer[beta._4_4_] = -(double)r * newVector_00[beta._4_4_] + v2[beta._4_4_];
    }
    beta._0_4_ = beta._0_4_ + 1;
    omega = dVar2;
  }
  return;
}

Assistant:

void Iterative_method_BiCGSTAB (
    Sparse_matrix const * matrix,
    double              * x,
    double const        * b,
    unsigned              max_iter,
    Precond_type          precond,
    double                omega_precond, /* default = 1 */
    double                accuracy,
    double              * buffer /* we need 8 * size */
  ) {

  register unsigned size   = matrix->size;
  register double alpha    = 1;
  register double rho      = 1;
  register double omega    = 1;
  double *r       = buffer;
  double *rcap    = buffer + size;
  double *v       = buffer + size * 2;
  double *p       = buffer + size * 3;
  double *y       = buffer + size * 4;
  double *z       = buffer + size * 5;
  double *s       = buffer + size * 6;
  double *t       = buffer + size * 7;

  register unsigned i, iter;
  register double beta, rhoold;

  register const double bnorm2 = scalar_product(b, b, size);
  register const double accuracy2 = accuracy * accuracy;

  Sparse_matrix_Apply_to_vector (matrix, x, r);
  memset (v, 0, size * sizeof(double));
  memset (p, 0, size * sizeof(double));
  for (i = 0; i < size; ++i) {
    r[i] = b[i] - r[i];
    rcap[i] = r[i];
  }

  for (iter = 1; iter < max_iter; ++iter) {
    rhoold = rho;
    rho = scalar_product (rcap, r, size);
    // beta = (rho / rhoold) * (alpha / omega);
    // should be faster:
    beta = (rho * alpha) / (rhoold * omega);
    for (i = 0; i < size; ++i) {
      p[i] = r[i] + beta * (p[i] - omega * v[i]);
    }
    (*precond)(matrix, p, y, omega_precond);
    Sparse_matrix_Apply_to_vector (matrix, y, v);
    alpha = rho / scalar_product (rcap, v, size);
    for (i = 0; i < size; ++i) {
      s[i] = r[i] - alpha * v[i];
    }
    (*precond)(matrix, s, z, omega_precond);
    Sparse_matrix_Apply_to_vector (matrix, z, t);
    omega = scalar_product (t, s, size) /
            scalar_product (t, t, size);
    for (i = 0; i < size; ++i) {
      x[i] += (alpha * y[i] + omega * z[i]);
    }
    if (scalar_product(r, r, size) < accuracy2 * bnorm2) {
      return;
    }
    for (i = 0; i < size; ++i) {
      r[i] = s[i] - omega * t[i];
    }
  }
  printf ("\nWarning: maximum number of iterations reached: %u.\n", max_iter);
}